

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::mousePressEvent(QAbstractItemView *this,QMouseEvent *event)

{
  QAbstractItemViewPrivate *this_00;
  QWidget *this_01;
  undefined1 uVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  SelectionFlag SVar5;
  LayoutDirection LVar6;
  int iVar7;
  SelectionFlag SVar8;
  int iVar9;
  Data *pDVar10;
  ulong uVar11;
  long lVar12;
  QPoint QVar13;
  long lVar14;
  QModelIndex *pQVar15;
  QObject *pQVar16;
  long in_FS_OFFSET;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  QPersistentModelIndex index;
  QModelIndex local_78;
  QPersistentModelIndex local_58;
  undefined8 local_50;
  QModelIndex local_48;
  
  local_48.m.ptr = *(QAbstractItemModel **)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  this_00->releaseFromDoubleClick = false;
  QBasicTimer::stop();
  auVar21 = QEventPoint::position();
  dVar19 = (double)((ulong)auVar21._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar21._0_8_;
  dVar20 = dVar19;
  if (dVar19 <= -2147483648.0) {
    dVar20 = -2147483648.0;
  }
  dVar17 = (double)((ulong)auVar21._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar21._8_8_;
  dVar18 = dVar17;
  if (dVar17 <= -2147483648.0) {
    dVar18 = -2147483648.0;
  }
  local_50 = (QModelIndex *)
             CONCAT44((int)(double)(-(ulong)(2147483647.0 < dVar17) & 0x41dfffffffc00000 |
                                   ~-(ulong)(2147483647.0 < dVar17) & (ulong)dVar18),
                      (int)(double)(-(ulong)(2147483647.0 < dVar19) & 0x41dfffffffc00000 |
                                   ~-(ulong)(2147483647.0 < dVar19) & (ulong)dVar20));
  local_58.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)this + 0x1f0))(&local_78,this);
  QPersistentModelIndex::QPersistentModelIndex(&local_58,&local_78);
  if ((this_00->pressClosedEditorWatcher).m_id == Invalid) {
    uVar1 = false;
  }
  else {
    uVar1 = comparesEqual(&this_00->lastEditedIndex,&local_58);
  }
  this_00->pressClosedEditor = (bool)uVar1;
  pDVar10 = (this_00->selectionModel).wp.d;
  if (((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) ||
     ((this_00->selectionModel).wp.value == (QObject *)0x0)) goto LAB_0053286f;
  if (this_00->state == EditingState) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
    bVar2 = QAbstractItemViewPrivate::hasEditor(this_00,&local_78);
    if (bVar2) goto LAB_0053286f;
    pDVar10 = (this_00->selectionModel).wp.d;
    if (pDVar10 != (Data *)0x0) goto LAB_0053269f;
LAB_005326af:
    pQVar15 = (QModelIndex *)0x0;
  }
  else {
LAB_0053269f:
    if (*(int *)(pDVar10 + 4) == 0) goto LAB_005326af;
    pQVar15 = (QModelIndex *)(this_00->selectionModel).wp.value;
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
  bVar2 = (bool)QItemSelectionModel::isSelected(pQVar15);
  this_00->pressedAlreadySelected = bVar2;
  QPersistentModelIndex::operator=(&this_00->pressedIndex,&local_58);
  (this_00->pressedModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = *(Int *)(event + 0x20);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
  SVar5 = (**(code **)(*(long *)this + 0x2e8))(this,&local_78,event);
  if (SVar5 == NoUpdate) {
    bVar3 = true;
  }
  else {
    bVar3 = QPersistentModelIndex::isValid();
    bVar3 = bVar3 ^ 1;
  }
  this_00->noSelectionOnMousePress = (bool)bVar3;
  this_01 = *(QWidget **)
             &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  LVar6 = QWidget::layoutDirection(this_01);
  iVar7 = (**(code **)(*(long *)this_01 + 0x2b0))(this_01);
  iVar9 = -iVar7;
  if (LVar6 != RightToLeft) {
    iVar9 = iVar7;
  }
  iVar7 = (**(code **)(*(long *)this_01 + 0x2b8))(this_01);
  QVar13.xp.m_i = iVar9 + (int)local_50;
  QVar13.yp.m_i = iVar7 + local_50._4_4_;
  this_00->draggedPosition = QVar13;
  if (this_00->dragEnabled == true) {
    this_00->pressedPosition = QVar13;
  }
  if ((SVar5 & Current) == NoUpdate) {
    this_00->pressedPosition = QVar13;
    QPersistentModelIndex::operator=(&this_00->currentSelectionStartIndex,&local_58);
  }
  else {
    cVar4 = QPersistentModelIndex::isValid();
    if (cVar4 == '\0') {
      currentIndex(&local_78,this);
      QPersistentModelIndex::operator=(&this_00->currentSelectionStartIndex,&local_78);
    }
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
  cVar4 = (**(code **)(*(long *)this + 0x2e0))(this,&local_78,0,event);
  if (cVar4 == '\0') {
    cVar4 = QPersistentModelIndex::isValid();
    if (cVar4 != '\0') {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
      uVar11 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_78);
      if ((uVar11 & 0x20) != 0) {
        bVar2 = this_00->autoScroll;
        this_00->autoScroll = false;
        pDVar10 = (this_00->selectionModel).wp.d;
        if ((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) {
          pQVar16 = (QObject *)0x0;
        }
        else {
          pQVar16 = (this_00->selectionModel).wp.value;
        }
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
        (**(code **)(*(long *)pQVar16 + 0x60))(pQVar16,&local_78,0);
        this_00->autoScroll = bVar2;
        if ((SVar5 & Toggle) != NoUpdate) {
          pDVar10 = (this_00->selectionModel).wp.d;
          if ((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) {
            pQVar15 = (QModelIndex *)0x0;
          }
          else {
            pQVar15 = (QModelIndex *)(this_00->selectionModel).wp.value;
          }
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
          bVar3 = QItemSelectionModel::isSelected(pQVar15);
          SVar8 = (uint)bVar3 * 2 + Select;
          this_00->ctrlDragSelectionFlag = SVar8;
          SVar5 = SVar5 & ~Toggle | SVar8;
        }
        if ((SVar5 & Current) == NoUpdate) {
          pQVar15 = &local_78;
          local_78._0_8_ = local_50;
          local_78.i = (quintptr)local_50;
        }
        else {
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    (&local_78,&this_00->currentSelectionStartIndex);
          auVar21 = (**(code **)(*(long *)this + 0x1e0))(this,&local_78);
          lVar14 = (long)auVar21._8_4_ + (long)auVar21._0_4_;
          lVar12 = (auVar21._8_8_ >> 0x20) + (auVar21._0_8_ >> 0x20);
          pQVar15 = &local_48;
          local_48.c = (int)((ulong)(lVar12 - (lVar12 >> 0x3f)) >> 1);
          local_48.r = (int)((ulong)(lVar14 - (lVar14 >> 0x3f)) >> 1);
          local_48.i = (quintptr)local_50;
        }
        (**(code **)(*(long *)this + 0x2c8))(this,pQVar15,SVar5);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
        local_48.r = 0;
        local_48.c = 0;
        local_48.i = (quintptr)&local_78;
        QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_48);
        if (this_00->autoScroll == true) {
          iVar9 = QApplication::doubleClickInterval();
          QBasicTimer::start(&this_00->delayedAutoScroll,(long)(iVar9 + 100) * 1000000,1,this);
        }
        goto LAB_0053286f;
      }
    }
    pQVar16 = (this_00->selectionModel).wp.value;
    local_78._0_8_ = (QModelIndex *)0xffffffffffffffff;
    local_78.i = 0;
    local_78.m.ptr = (QAbstractItemModel *)0x0;
    (**(code **)(*(long *)pQVar16 + 0x68))(pQVar16,&local_78,2);
  }
LAB_0053286f:
  QPersistentModelIndex::~QPersistentModelIndex(&local_58);
  if (*(QAbstractItemModel **)(in_FS_OFFSET + 0x28) == local_48.m.ptr) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::mousePressEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    d->releaseFromDoubleClick = false;
    d->delayedAutoScroll.stop(); //any interaction with the view cancel the auto scrolling
    QPoint pos = event->position().toPoint();
    QPersistentModelIndex index = indexAt(pos);

    // this is the mouse press event that closed the last editor (via focus event)
    d->pressClosedEditor = d->pressClosedEditorWatcher.isActive() && d->lastEditedIndex == index;

    if (!d->selectionModel || (d->state == EditingState && d->hasEditor(index)))
        return;

    d->pressedAlreadySelected = d->selectionModel->isSelected(index);
    d->pressedIndex = index;
    d->pressedModifiers = event->modifiers();
    QItemSelectionModel::SelectionFlags command = selectionCommand(index, event);
    d->noSelectionOnMousePress = command == QItemSelectionModel::NoUpdate || !index.isValid();
    QPoint offset = d->offset();
    d->draggedPosition = pos + offset;

#if QT_CONFIG(draganddrop)
    // update the pressed position when drag was enable
    if (d->dragEnabled)
        d->pressedPosition = d->draggedPosition;
#endif

    if (!(command & QItemSelectionModel::Current)) {
        d->pressedPosition = pos + offset;
        d->currentSelectionStartIndex = index;
    }
    else if (!d->currentSelectionStartIndex.isValid())
        d->currentSelectionStartIndex = currentIndex();

    if (edit(index, NoEditTriggers, event))
        return;

    if (index.isValid() && d->isIndexEnabled(index)) {
        // we disable scrollTo for mouse press so the item doesn't change position
        // when the user is interacting with it (ie. clicking on it)
        bool autoScroll = d->autoScroll;
        d->autoScroll = false;
        d->selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
        d->autoScroll = autoScroll;
        if (command.testFlag(QItemSelectionModel::Toggle)) {
            command &= ~QItemSelectionModel::Toggle;
            d->ctrlDragSelectionFlag = d->selectionModel->isSelected(index) ? QItemSelectionModel::Deselect : QItemSelectionModel::Select;
            command |= d->ctrlDragSelectionFlag;
        }

        if (!(command & QItemSelectionModel::Current)) {
            setSelection(QRect(pos, QSize(1, 1)), command);
        } else {
            QRect rect(visualRect(d->currentSelectionStartIndex).center(), pos);
            setSelection(rect, command);
        }

        // signal handlers may change the model
        emit pressed(index);
        if (d->autoScroll) {
            //we delay the autoscrolling to filter out double click event
            //100 is to be sure that there won't be a double-click misinterpreted as a 2 single clicks
            d->delayedAutoScroll.start(QApplication::doubleClickInterval()+100, this);
        }

    } else {
        // Forces a finalize() even if mouse is pressed, but not on a item
        d->selectionModel->select(QModelIndex(), QItemSelectionModel::Select);
    }
}